

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O2

void __thiscall
duckdb::CardinalityEstimator::AddRelationTdom(CardinalityEstimator *this,FilterInfo *filter_info)

{
  pointer pRVar1;
  const_iterator cVar2;
  vector<duckdb::RelationsToTDom,_true> *__range1;
  pointer this_00;
  RelationsToTDom new_r2tdom;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  RelationsToTDom local_a0;
  
  this_00 = (this->relations_to_tdoms).
            super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
            super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->relations_to_tdoms).
           super_vector<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           super__Vector_base<duckdb::RelationsToTDom,_std::allocator<duckdb::RelationsToTDom>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == pRVar1) {
      local_e8 = (undefined4)(filter_info->left_binding).table_index;
      uStack_e4 = *(undefined4 *)((long)&(filter_info->left_binding).table_index + 4);
      uStack_e0 = (undefined4)(filter_info->left_binding).column_index;
      uStack_dc = *(undefined4 *)((long)&(filter_info->left_binding).column_index + 4);
      ::std::
      _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<duckdb::ColumnBinding_const*>
                ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_d8,&local_e8,&local_d8,0,&local_e9,&local_ea,&local_eb);
      RelationsToTDom::RelationsToTDom(&local_a0,(column_binding_set_t *)&local_d8);
      ::std::
      _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_d8);
      ::std::vector<duckdb::RelationsToTDom,std::allocator<duckdb::RelationsToTDom>>::
      emplace_back<duckdb::RelationsToTDom&>
                ((vector<duckdb::RelationsToTDom,std::allocator<duckdb::RelationsToTDom>> *)this,
                 &local_a0);
      RelationsToTDom::~RelationsToTDom(&local_a0);
      return;
    }
    cVar2 = ::std::
            _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this_00,&filter_info->left_binding);
    this_00 = this_00 + 1;
  } while (cVar2.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur == (__node_type *)0x0
          );
  return;
}

Assistant:

void CardinalityEstimator::AddRelationTdom(FilterInfo &filter_info) {
	D_ASSERT(filter_info.set.get().count >= 1);
	for (const RelationsToTDom &r2tdom : relations_to_tdoms) {
		auto &i_set = r2tdom.equivalent_relations;
		if (i_set.find(filter_info.left_binding) != i_set.end()) {
			// found an equivalent filter
			return;
		}
	}

	auto key = ColumnBinding(filter_info.left_binding.table_index, filter_info.left_binding.column_index);
	RelationsToTDom new_r2tdom(column_binding_set_t({key}));

	relations_to_tdoms.emplace_back(new_r2tdom);
}